

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-0.c
# Opt level: O3

int CheckFromArray(void)

{
  int iVar1;
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  int n;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    iVar1 = -1;
  }
  else {
    if (0 < testInOut[testN].n) {
      lVar3 = 0;
      do {
        pcVar2 = ScanInt((FILE *)__stream,(int *)((long)&uStack_38 + 4));
        if (pcVar2 != "PASSED") {
LAB_00102452:
          fclose(__stream);
          goto LAB_0010245a;
        }
        if (*(int *)((long)testN * 0x90 + 0x10632c + lVar3 * 4) != uStack_38._4_4_) {
          printf("wrong output -- ");
          goto LAB_00102452;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < testInOut[testN].n);
    }
    iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
    fclose(__stream);
    if (iVar1 == 0) {
      puts("PASSED");
      iVar1 = 0;
    }
    else {
LAB_0010245a:
      puts("FAILED");
      iVar1 = 1;
    }
  }
  testN = testN + 1;
  return iVar1;
}

Assistant:

static int CheckFromArray(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i, passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < testInOut[testN].n; i++) {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
            break;
        } else if (testInOut[testN].out[i] != n) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}